

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.cc
# Opt level: O1

void __thiscall
QPDFSystemError::QPDFSystemError(QPDFSystemError *this,string *description,int system_errno)

{
  pointer pcVar1;
  string local_40;
  
  createWhat(&local_40,description,system_errno);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)this = &PTR__QPDFSystemError_002f2138;
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + description->_M_string_length);
  this->system_errno = system_errno;
  return;
}

Assistant:

QPDFSystemError::QPDFSystemError(std::string const& description, int system_errno) :
    std::runtime_error(createWhat(description, system_errno)),
    description(description),
    system_errno(system_errno)
{
}